

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *guid;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  char cVar27;
  int iVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  char cVar32;
  long lVar33;
  char *pcVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  anon_struct_16_2_6ab6935c fields [22];
  char *local_1a8;
  undefined8 uStack_1a0;
  char *local_198 [3];
  _GLFWmapelement *local_180;
  char *local_178;
  _GLFWmapelement *local_170;
  char *local_168;
  _GLFWmapelement *local_160;
  char *local_158;
  _GLFWmapelement *local_150;
  char *local_148;
  _GLFWmapelement *local_140;
  char *local_138;
  _GLFWmapelement *local_130;
  char *local_128;
  _GLFWmapelement *local_120;
  char *local_118;
  _GLFWmapelement *local_110;
  char *local_108;
  _GLFWmapelement *local_100;
  char *local_f8;
  _GLFWmapelement *local_f0;
  char *local_e8;
  _GLFWmapelement *local_e0;
  char *local_d8;
  _GLFWmapelement *local_d0;
  char *local_c8;
  _GLFWmapelement *local_c0;
  char *local_b8;
  _GLFWmapelement *local_b0;
  char *local_a8;
  _GLFWmapelement *local_a0;
  char *local_98;
  _GLFWmapelement *local_90;
  char *local_88;
  _GLFWmapelement *local_80;
  char *local_78;
  _GLFWmapelement *local_70;
  char *local_68;
  _GLFWmapelement *local_60;
  char *local_58;
  _GLFWmapelement *local_50;
  char *local_48;
  _GLFWmapelement *local_40;
  
  local_198[0] = "platform";
  local_198[1] = (char *)0x0;
  local_198[2] = "a";
  local_180 = mapping->buttons;
  local_178 = "b";
  local_170 = mapping->buttons + 1;
  local_168 = "x";
  local_160 = mapping->buttons + 2;
  local_158 = "y";
  local_150 = mapping->buttons + 3;
  local_148 = "back";
  local_140 = mapping->buttons + 6;
  local_138 = "start";
  local_130 = mapping->buttons + 7;
  local_128 = "guide";
  local_120 = mapping->buttons + 8;
  local_118 = "leftshoulder";
  local_110 = mapping->buttons + 4;
  local_108 = "rightshoulder";
  local_100 = mapping->buttons + 5;
  local_f8 = "leftstick";
  local_f0 = mapping->buttons + 9;
  local_e8 = "rightstick";
  local_e0 = mapping->buttons + 10;
  local_d8 = "dpup";
  local_d0 = mapping->buttons + 0xb;
  local_c8 = "dpright";
  local_c0 = mapping->buttons + 0xc;
  local_b8 = "dpdown";
  local_b0 = mapping->buttons + 0xd;
  local_a8 = "dpleft";
  local_a0 = mapping->buttons + 0xe;
  local_98 = "lefttrigger";
  local_70 = mapping->axes;
  local_90 = mapping->axes + 4;
  local_88 = "righttrigger";
  local_80 = mapping->axes + 5;
  local_78 = "leftx";
  local_68 = "lefty";
  local_60 = mapping->axes + 1;
  local_58 = "rightx";
  local_50 = mapping->axes + 2;
  local_48 = "righty";
  local_40 = mapping->axes + 3;
  local_1a8 = string;
  sVar29 = strcspn(string,",");
  if ((sVar29 == 0x20) && (string[0x20] == ',')) {
    uVar24 = *(undefined8 *)string;
    uVar25 = *(undefined8 *)(string + 8);
    uVar26 = *(undefined8 *)(string + 0x18);
    *(undefined8 *)(mapping->guid + 0x10) = *(undefined8 *)(string + 0x10);
    *(undefined8 *)(mapping->guid + 0x18) = uVar26;
    *(undefined8 *)mapping->guid = uVar24;
    *(undefined8 *)(mapping->guid + 8) = uVar25;
    pcVar34 = string + 0x21;
    local_1a8 = pcVar34;
    sVar29 = strcspn(pcVar34,",");
    if ((sVar29 < 0x80) && (pcVar34[sVar29] == ',')) {
      guid = mapping->guid;
      memcpy(mapping,pcVar34,sVar29);
      pcVar34 = pcVar34 + sVar29 + 1;
      do {
        cVar27 = *pcVar34;
        local_1a8 = pcVar34;
        if (cVar27 == '\0') {
          lVar33 = 0;
          do {
            pcVar34 = guid + lVar33;
            bVar35 = pcVar34[1];
            bVar10 = pcVar34[2];
            bVar11 = pcVar34[3];
            bVar12 = pcVar34[4];
            bVar13 = pcVar34[5];
            bVar14 = pcVar34[6];
            bVar15 = pcVar34[7];
            bVar16 = pcVar34[8];
            bVar17 = pcVar34[9];
            bVar18 = pcVar34[10];
            bVar19 = pcVar34[0xb];
            bVar20 = pcVar34[0xc];
            bVar21 = pcVar34[0xd];
            bVar22 = pcVar34[0xe];
            bVar23 = pcVar34[0xf];
            bVar36 = *pcVar34 + 0xbf;
            bVar37 = bVar35 + 0xbf;
            bVar38 = bVar10 + 0xbf;
            bVar39 = bVar11 + 0xbf;
            bVar40 = bVar12 + 0xbf;
            bVar41 = bVar13 + 0xbf;
            bVar42 = bVar14 + 0xbf;
            bVar43 = bVar15 + 0xbf;
            bVar2 = (byte)((5 < bVar36) * '\x05' | (5 >= bVar36) * bVar36) == bVar36;
            bVar3 = (byte)((5 < bVar37) * '\x05' | (5 >= bVar37) * bVar37) == bVar37;
            bVar4 = (byte)((5 < bVar38) * '\x05' | (5 >= bVar38) * bVar38) == bVar38;
            bVar5 = (byte)((5 < bVar39) * '\x05' | (5 >= bVar39) * bVar39) == bVar39;
            bVar6 = (byte)((5 < bVar40) * '\x05' | (5 >= bVar40) * bVar40) == bVar40;
            bVar7 = (byte)((5 < bVar41) * '\x05' | (5 >= bVar41) * bVar41) == bVar41;
            bVar8 = (byte)((5 < bVar42) * '\x05' | (5 >= bVar42) * bVar42) == bVar42;
            bVar9 = (byte)((5 < bVar43) * '\x05' | (5 >= bVar43) * bVar43) == bVar43;
            if (bVar2) {
              guid[lVar33] = *pcVar34 | 0x20;
            }
            if (bVar3) {
              mapping->guid[lVar33 + 1] = bVar35 | 0x20;
            }
            if (bVar4) {
              mapping->guid[lVar33 + 2] = bVar10 | 0x20;
            }
            if (bVar5) {
              mapping->guid[lVar33 + 3] = bVar11 | 0x20;
            }
            if (bVar6) {
              mapping->guid[lVar33 + 4] = bVar12 | 0x20;
            }
            if (bVar7) {
              mapping->guid[lVar33 + 5] = bVar13 | 0x20;
            }
            if (bVar8) {
              mapping->guid[lVar33 + 6] = bVar14 | 0x20;
            }
            if (bVar9) {
              mapping->guid[lVar33 + 7] = bVar15 | 0x20;
            }
            if (bVar2) {
              mapping->guid[lVar33 + 8] = bVar16 | 0x20;
            }
            if (bVar3) {
              mapping->guid[lVar33 + 9] = bVar17 | 0x20;
            }
            if (bVar4) {
              mapping->guid[lVar33 + 10] = bVar18 | 0x20;
            }
            if (bVar5) {
              mapping->guid[lVar33 + 0xb] = bVar19 | 0x20;
            }
            if (bVar6) {
              mapping->guid[lVar33 + 0xc] = bVar20 | 0x20;
            }
            if (bVar7) {
              mapping->guid[lVar33 + 0xd] = bVar21 | 0x20;
            }
            if (bVar8) {
              mapping->guid[lVar33 + 0xe] = bVar22 | 0x20;
            }
            if (bVar9) {
              mapping->guid[lVar33 + 0xf] = bVar23 | 0x20;
            }
            lVar33 = lVar33 + 0x10;
          } while (lVar33 != 0x20);
          _glfwPlatformUpdateGamepadGUID(guid);
          return 1;
        }
        if (cVar27 == '+') {
          return 0;
        }
        if (cVar27 == '-') {
          return 0;
        }
        lVar33 = 8;
        do {
          pcVar1 = *(char **)((long)&uStack_1a0 + lVar33);
          sVar29 = strlen(pcVar1);
          iVar28 = strncmp(pcVar34,pcVar1,sVar29);
          if ((iVar28 == 0) && (pcVar34[sVar29] == ':')) {
            local_1a8 = pcVar34 + sVar29 + 1;
            pcVar1 = *(char **)((long)local_198 + lVar33);
            if (pcVar1 == (char *)0x0) {
              iVar28 = strncmp(local_1a8,"Linux",5);
              if (iVar28 != 0) {
                return 0;
              }
              break;
            }
            if (*local_1a8 == '-') {
              uStack_1a0._4_4_ = -1;
              local_1a8 = pcVar34 + sVar29 + 2;
              iVar28 = 0;
            }
            else {
              iVar28 = 1;
              if (*local_1a8 == '+') {
                local_1a8 = pcVar34 + sVar29 + 2;
                uStack_1a0._4_4_ = 0;
              }
              else {
                uStack_1a0._4_4_ = -1;
              }
            }
            cVar27 = *local_1a8;
            if (cVar27 == 'a') {
              bVar2 = false;
              cVar27 = '\x01';
            }
            else if (cVar27 == 'h') {
              cVar27 = '\x03';
              bVar2 = true;
            }
            else {
              if (cVar27 != 'b') break;
              cVar27 = '\x02';
              bVar2 = false;
            }
            *pcVar1 = cVar27;
            uVar30 = strtoul(local_1a8 + 1,&local_1a8,10);
            bVar35 = (byte)uVar30;
            if (bVar2) {
              uVar31 = strtoul(local_1a8 + 1,&local_1a8,10);
              bVar35 = (byte)(uVar30 << 4) | (byte)uVar31;
            }
            pcVar1[1] = bVar35;
            if (*pcVar1 == '\x01') {
              cVar27 = (char)(2 / (ulong)(uint)(iVar28 - uStack_1a0._4_4_));
              pcVar1[2] = cVar27;
              cVar32 = (char)iVar28 + (char)uStack_1a0._4_4_;
              pcVar1[3] = -cVar32;
              if (*local_1a8 == '~') {
                pcVar1[2] = -cVar27;
                pcVar1[3] = cVar32;
              }
            }
            break;
          }
          lVar33 = lVar33 + 0x10;
        } while (lVar33 != 0x168);
        pcVar34 = local_1a8;
        sVar29 = strcspn(local_1a8,",");
        pcVar34 = pcVar34 + sVar29;
        local_1a8 = pcVar34;
        sVar29 = strspn(pcVar34,",");
        pcVar34 = pcVar34 + sVar29;
      } while( true );
    }
  }
  _glfwInputError(0x10004,(char *)0x0);
  return 0;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                length = strlen(_GLFW_PLATFORM_MAPPING_NAME);
                if (strncmp(c, _GLFW_PLATFORM_MAPPING_NAME, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfwPlatformUpdateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}